

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
* __thiscall
testing::internal::
FunctionMocker<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
::With(MockSpec<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
       *__return_storage_ptr__,
      FunctionMocker<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
      *this,Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&> *m,
      Matcher<int> *m_1,Matcher<unsigned_int> *m_2)

{
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  local_60;
  
  std::
  _Tuple_impl<0ul,testing::Matcher<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>
  ::
  _Tuple_impl<testing::Matcher<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>,void>
            ((_Tuple_impl<0ul,testing::Matcher<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>
              *)&local_60,m,m_1,m_2);
  __return_storage_ptr__->function_mocker_ = this;
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  ::_Tuple_impl(&(__return_storage_ptr__->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                ,&local_60);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  ::~_Tuple_impl(&local_60);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }